

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_slow(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CClass *pCVar3;
  void *arg2;
  char *pcVar4;
  AFFECT_DATA af;
  
  pCVar3 = char_data::Class(ch);
  bVar1 = RString::operator==(&pCVar3->name,"assassin");
  if (((CHAR_DATA *)vo != ch) && (bVar1)) {
    pcVar4 = "You are only able to slow your own metabolism.\n\r";
LAB_00309f78:
    send_to_char(pcVar4,ch);
    return;
  }
  bVar1 = is_safe(ch,(CHAR_DATA *)vo);
  if (bVar1) {
    return;
  }
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if ((bVar1) || (bVar1 = is_affected_by((CHAR_DATA *)vo,0x1d), bVar1)) {
    if ((CHAR_DATA *)vo == ch) {
      pcVar4 = "You can\'t move any slower!\n\r";
      goto LAB_00309f78;
    }
    pcVar4 = "$N can\'t get any slower than that.";
    iVar2 = 3;
    arg2 = vo;
  }
  else {
    bVar1 = is_affected_by((CHAR_DATA *)vo,0x15);
    if (!bVar1) {
      init_affect(&af);
      af.where = 0;
      af.aftype = 0;
      af.type = (short)sn;
      af.level = (short)level;
      af.duration = (short)(level / 4);
      af.location = 2;
      af.modifier = (~(ushort)(0x11 < level) - (ushort)(0x18 < level)) - (ushort)(0x1f < level);
      af.bitvector[0]._3_1_ = af.bitvector[0]._3_1_ | 0x20;
      af.mod_name = 3;
      affect_to_char((CHAR_DATA *)vo,&af);
      send_to_char("You feel yourself moving more slowly.\n\r",(CHAR_DATA *)vo);
      act("$n is moving more slowly.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      bVar1 = trusts(ch,(CHAR_DATA *)vo);
      if (bVar1) {
        return;
      }
      multi_hit((CHAR_DATA *)vo,ch,-1);
      return;
    }
    iVar2 = skill_lookup("haste");
    switchD_00333f01::default((CHAR_DATA *)vo,iVar2);
    bVar1 = is_affected_by((CHAR_DATA *)vo,0x15);
    if (bVar1) {
      *(byte *)((long)vo + 0x1ea) = *(byte *)((long)vo + 0x1ea) & 0xdf;
    }
    send_to_char("You start moving at normal speed again.\n\r",(CHAR_DATA *)vo);
    pcVar4 = "$n starts moving at normal speed again.";
    arg2 = (void *)0x0;
    iVar2 = 0;
    ch = (CHAR_DATA *)vo;
  }
  act(pcVar4,ch,(void *)0x0,arg2,iVar2);
  return;
}

Assistant:

void spell_slow(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (ch->Class()->name == "assassin" && victim != ch)
	{
		send_to_char("You are only able to slow your own metabolism.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (is_affected(victim, sn) || is_affected_by(victim, AFF_SLOW))
	{
		if (victim == ch)
			send_to_char("You can't move any slower!\n\r", ch);
		else
			act("$N can't get any slower than that.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	if (is_affected_by(victim, AFF_HASTE))
	{
		affect_strip(victim, skill_lookup("haste"));

		if (is_affected_by(victim, AFF_HASTE))
			REMOVE_BIT(victim->affected_by, AFF_HASTE);

		send_to_char("You start moving at normal speed again.\n\r", victim);
		act("$n starts moving at normal speed again.", victim, nullptr, nullptr, TO_ROOM);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = level / 4;
	af.location = APPLY_DEX;
	af.modifier = -1 - (level >= 18) - (level >= 25) - (level >= 32);

	SET_BIT(af.bitvector, AFF_SLOW);

	af.mod_name = MOD_SPEED;
	affect_to_char(victim, &af);

	send_to_char("You feel yourself moving more slowly.\n\r", victim);
	act("$n is moving more slowly.", victim, nullptr, nullptr, TO_ROOM);

	if (!trusts(ch, victim))
		multi_hit(victim, ch, TYPE_UNDEFINED);
}